

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base_matrix_with_column_compression.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>
::_insert_column(Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>
                 *this,Index columnIndex)

{
  bool bVar1;
  Index IVar2;
  reference ppCVar3;
  pointer this_00;
  pointer this_01;
  undefined1 local_30 [8];
  pair<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_bool>
  res;
  Column *col;
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>
  *pBStack_10;
  Index columnIndex_local;
  Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>
  *this_local;
  
  col._4_4_ = columnIndex;
  pBStack_10 = this;
  ppCVar3 = std::
            vector<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column_*>_>
            ::operator[](&this->repToColumn_,(ulong)columnIndex);
  res._8_8_ = *ppCVar3;
  bVar1 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>
          ::is_empty((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>
                      *)res._8_8_);
  if (bVar1) {
    this_00 = std::
              unique_ptr<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>_>_>
              ::operator->(&this->columnPool_);
    Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column>
    ::destroy(this_00,(pointer)res._8_8_);
    ppCVar3 = std::
              vector<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column_*>_>
              ::operator[](&this->repToColumn_,(ulong)col._4_4_);
    *ppCVar3 = (value_type)0x0;
  }
  else {
    Column::set_rep((Column *)res._8_8_,(Index *)((long)&col + 4));
    boost::intrusive::
    set_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_void>
    ::insert((set_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_void>
              *)local_30,(reference)&this->columnToRep_);
    this_01 = boost::intrusive::
              tree_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
              ::operator->((tree_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false>_>_>::Column,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
                            *)local_30);
    IVar2 = Column::get_rep(this_01);
    if (IVar2 != col._4_4_) {
      _insert_double_column(this,col._4_4_,(iterator *)local_30);
    }
  }
  return;
}

Assistant:

inline void Base_matrix_with_column_compression<Master_matrix>::_insert_column(Index columnIndex)
{
  Column& col = *repToColumn_[columnIndex];

  if (col.is_empty()) {
    columnPool_->destroy(&col);  // delete curr_col;
    repToColumn_[columnIndex] = nullptr;
    return;
  }

  col.set_rep(columnIndex);
  auto res = columnToRep_.insert(col);
  if (res.first->get_rep() != columnIndex) {  //if true, then redundant column
    _insert_double_column(columnIndex, res.first);
  }
}